

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

void __thiscall
v_hashmap<substring,_features_*>::iter
          (v_hashmap<substring,_features_*> *this,_func_void_substring_features_ptr *func)

{
  char *pcVar1;
  
  for (pcVar1 = *(char **)(this + 0x18); pcVar1 != *(char **)(this + 0x28); pcVar1 = pcVar1 + 0x28)
  {
    if (*pcVar1 == '\x01') {
      (*func)(*(substring *)(pcVar1 + 8),*(features **)(pcVar1 + 0x18));
    }
  }
  return;
}

Assistant:

void iter(void (*func)(K, V))
  {  // for (size_t lp=0; lp<base_size(); lp++) {
    for (hash_elem* e = dat.begin(); e != dat.end_array; e++)
    {  // hash_elem* e = dat.begin()+lp;
      if (e->occupied)
      {  // printf("  [lp=%d\tocc=%d\thash=%llu]\n", lp, e->occupied, e->hash);
        func(e->key, e->val);
      }
    }
  }